

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmLibrary.cpp
# Opt level: O1

void Js::WasmLibrary::ResetFunctionBodyDefaultEntryPoint(FunctionBody *body)

{
  undefined1 *puVar1;
  code *pcVar2;
  bool bVar3;
  FunctionEntryPointInfo *pFVar4;
  undefined4 *puVar5;
  
  pFVar4 = FunctionBody::GetDefaultFunctionEntryPointInfo(body);
  puVar1 = &(pFVar4->super_EntryPointInfo).field_0x18;
  *puVar1 = *puVar1 | 8;
  pFVar4 = FunctionBody::GetDefaultFunctionEntryPointInfo(body);
  (pFVar4->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod =
       InterpreterStackFrame::AsmJsDelayDynamicInterpreterThunk;
  if ((body->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4e3,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) goto LAB_00d97143;
    *puVar5 = 0;
  }
  if ((FunctionBody *)
      (((body->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->functionBodyImpl)
      .ptr != body) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4e4,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar3) goto LAB_00d97143;
    *puVar5 = 0;
  }
  FunctionInfo::SetOriginalEntryPoint
            ((body->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr,
             InterpreterStackFrame::AsmJsDelayDynamicInterpreterThunk);
  body->field_0x17b = body->field_0x17b & 0x7f;
  bVar3 = FunctionProxy::HasValidEntryPoint((FunctionProxy *)body);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WasmLibrary.cpp"
                                ,0x1f,"(body->HasValidEntryPoint())","body->HasValidEntryPoint()");
    if (!bVar3) {
LAB_00d97143:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

void WasmLibrary::ResetFunctionBodyDefaultEntryPoint(FunctionBody* body)
    {
        body->GetDefaultFunctionEntryPointInfo()->SetIsAsmJSFunction(true);
        body->GetDefaultFunctionEntryPointInfo()->jsMethod = AsmJsDefaultEntryThunk;
        body->SetOriginalEntryPoint(AsmJsDefaultEntryThunk);
        // Reset jit status for this function
        body->SetIsAsmJsFullJitScheduled(false);
        Assert(body->HasValidEntryPoint());
    }